

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O2

SC_Lib * Abc_SclReadFromFile(char *pFileName)

{
  FILE *__stream;
  long lVar1;
  Vec_Str_t *vOut;
  size_t sVar2;
  SC_Lib *p;
  char *pcVar3;
  int nCap;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    p = (SC_Lib *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    rewind(__stream);
    nCap = (int)lVar1;
    vOut = Vec_StrAlloc(nCap);
    vOut->nSize = vOut->nCap;
    if (vOut->nCap != nCap) {
      __assert_fail("nFileSize == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                    ,0x1b4,"SC_Lib *Abc_SclReadFromFile(char *)");
    }
    sVar2 = fread(vOut->pArray,1,(long)nCap,__stream);
    if (nCap != (int)sVar2) {
      __assert_fail("nFileSize == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                    ,0x1b6,"SC_Lib *Abc_SclReadFromFile(char *)");
    }
    fclose(__stream);
    p = Abc_SclReadFromStr(vOut);
    if (p != (SC_Lib *)0x0) {
      pcVar3 = Abc_UtilStrsav(pFileName);
      p->pFileName = pcVar3;
      Abc_SclLibNormalize(p);
    }
    Vec_StrFree(vOut);
  }
  return p;
}

Assistant:

SC_Lib * Abc_SclReadFromFile( char * pFileName )
{
    SC_Lib * p;
    FILE * pFile;
    Vec_Str_t * vOut;
    int nFileSize;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // load the contents
    vOut = Vec_StrAlloc( nFileSize );
    vOut->nSize = vOut->nCap;
    assert( nFileSize == Vec_StrSize(vOut) );
    nFileSize = fread( Vec_StrArray(vOut), 1, Vec_StrSize(vOut), pFile );
    assert( nFileSize == Vec_StrSize(vOut) );
    fclose( pFile );
    // read the library
    p = Abc_SclReadFromStr( vOut );
    if ( p != NULL )
        p->pFileName = Abc_UtilStrsav( pFileName );
    if ( p != NULL )
        Abc_SclLibNormalize( p );
    Vec_StrFree( vOut );
    return p;
}